

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds03_heap_erase.cpp
# Opt level: O0

void __thiscall
CP::priority_queue<int,_std::less<int>_>::erase(priority_queue<int,_std::less<int>_> *this,int *v)

{
  size_t sVar1;
  int local_1c;
  int i;
  int *v_local;
  priority_queue<int,_std::less<int>_> *this_local;
  
  for (local_1c = 0; (ulong)(long)local_1c < this->mSize; local_1c = local_1c + 1) {
    if (this->mData[local_1c] == *v) {
      sVar1 = this->mSize;
      this->mSize = sVar1 - 1;
      this->mData[local_1c] = this->mData[sVar1 - 1];
    }
    fixUp(this,(long)local_1c);
    fixDown(this,(long)local_1c);
  }
  return;
}

Assistant:

void erase(const T &v) {
        for (int i = 0; i < mSize; ++i) {
            if (mData[i] == v)
                mData[i] = mData[(mSize--) - 1];
            fixUp(i);
            fixDown(i);
        }
    }